

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  pointer data;
  bool bVar1;
  LogMessage *other;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  size_t __n;
  LogFinisher local_71;
  string *local_70;
  LogMessage local_68;
  
  if (this->end_ <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
  }
  uVar2 = s->_M_string_length;
  if (this->end_ <= ptr) {
    local_70 = s;
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x36d);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
    s = local_70;
  }
  uVar4 = num * 8;
  *ptr = (byte)uVar4 + 2;
  if (uVar4 < 0x80) {
    pbVar5 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar4 | 0x82;
    ptr[1] = (byte)(uVar4 >> 7);
    pbVar5 = ptr + 2;
    if (0x3fff < uVar4) {
      uVar3 = (uint)ptr[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar5[-1] = (byte)uVar3 | 0x80;
        uVar3 = uVar4 >> 7;
        *pbVar5 = (byte)uVar3;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
  }
  uVar4 = (uint)uVar2;
  if (uVar4 < 0x80) {
    uVar2 = uVar2 & 0xffffffff;
  }
  else {
    uVar2 = uVar2 & 0xffffffff;
    do {
      uVar3 = (uint)uVar2;
      *pbVar5 = (byte)uVar2 | 0x80;
      uVar2 = uVar2 >> 7;
      pbVar5 = pbVar5 + 1;
    } while (0x3fff < uVar3);
  }
  *pbVar5 = (byte)uVar2;
  pbVar5 = pbVar5 + 1;
  data = (s->_M_dataplus)._M_p;
  __n = (size_t)(int)uVar4;
  if ((long)this->end_ - (long)pbVar5 < (long)__n) {
    pbVar5 = WriteRawFallback(this,data,uVar4,pbVar5);
  }
  else {
    memcpy(pbVar5,data,__n);
    pbVar5 = pbVar5 + __n;
  }
  return pbVar5;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num, const std::string& s,
                                               uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}